

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O1

void re2::SetPrefix(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> v;
  Set s;
  vector<int,_std::allocator<int>_> local_1f8;
  LogMessage local_1e0;
  Set local_60;
  
  RE2::Options::Options((Options *)&local_1e0,DefaultOptions);
  RE2::Set::Set(&local_60,(Options *)&local_1e0,ANCHOR_BOTH);
  local_1e0._0_8_ = "/prefix/\\d*";
  local_1e0._8_4_ = 0xb;
  iVar2 = RE2::Set::Add(&local_60,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Add(\"/prefix/\\\\d*\", __null)) == (0)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  bVar1 = RE2::Set::Compile(&local_60);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (s.Compile()) == (true)",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "/prefix";
  local_1e0._8_4_ = 7;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"/prefix\", __null)) == (false)",0x35);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "/prefix/";
  local_1e0._8_4_ = 8;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa0,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"/prefix/\", __null)) == (true)",0x35);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "/prefix/42";
  local_1e0._8_4_ = 10;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa1,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"/prefix/42\", __null)) == (true)",0x37);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e0._0_8_ = "/prefix";
  local_1e0._8_4_ = 7;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,&local_1f8);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa4,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"/prefix\", &v)) == (false)",0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa5,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v.size()) == (0)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "/prefix/";
  local_1e0._8_4_ = 8;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,&local_1f8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa7,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"/prefix/\", &v)) == (true)",0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if ((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa8,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v.size()) == (1)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != 0) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa9,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v[0]) == (0)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  local_1e0._0_8_ = "/prefix/42";
  local_1e0._8_4_ = 10;
  bVar1 = RE2::Set::Match(&local_60,(StringPiece *)&local_1e0,&local_1f8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xab,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),
               "Check failed: (s.Match(\"/prefix/42\", &v)) == (true)",0x33);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if ((long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xac,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v.size()) == (1)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != 0) {
    LogMessage::LogMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xad,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1e0 + 8),"Check failed: (v[0]) == (0)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  RE2::Set::~Set(&local_60);
  return;
}

Assistant:

TEST(Set, Prefix) {
  RE2::Set s(RE2::DefaultOptions, RE2::ANCHOR_BOTH);

  CHECK_EQ(s.Add("/prefix/\\d*", NULL), 0);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("/prefix", NULL), false);
  CHECK_EQ(s.Match("/prefix/", NULL), true);
  CHECK_EQ(s.Match("/prefix/42", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("/prefix", &v), false);
  CHECK_EQ(v.size(), 0);

  CHECK_EQ(s.Match("/prefix/", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);

  CHECK_EQ(s.Match("/prefix/42", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);
}